

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O0

unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>::get_options
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true> *this)

{
  bool bVar1;
  Display DVar2;
  pointer pOVar3;
  long in_RSI;
  unique_ptr<Apple::II::Machine::Options,_std::default_delete<Apple::II::Machine::Options>_>
  local_20;
  __single_object options;
  ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true> *this_local;
  
  std::make_unique<Apple::II::Machine::Options,Configurable::OptionsType>((OptionsType *)&local_20);
  DVar2 = MachineTypes::ScanProducer::get_video_signal_configurable((ScanProducer *)(in_RSI + 0x28))
  ;
  pOVar3 = std::
           unique_ptr<Apple::II::Machine::Options,_std::default_delete<Apple::II::Machine::Options>_>
           ::operator->(&local_20);
  (pOVar3->super_DisplayOption<Apple::II::Machine::Options>).output = DVar2;
  bVar1 = II::Video::VideoBase::get_use_square_pixels((VideoBase *)(in_RSI + 0xdd0));
  pOVar3 = std::
           unique_ptr<Apple::II::Machine::Options,_std::default_delete<Apple::II::Machine::Options>_>
           ::operator->(&local_20);
  pOVar3->use_square_pixels = bVar1;
  std::unique_ptr<Reflection::Struct,std::default_delete<Reflection::Struct>>::
  unique_ptr<Apple::II::Machine::Options,std::default_delete<Apple::II::Machine::Options>,void>
            ((unique_ptr<Reflection::Struct,std::default_delete<Reflection::Struct>> *)this,
             &local_20);
  std::unique_ptr<Apple::II::Machine::Options,_std::default_delete<Apple::II::Machine::Options>_>::
  ~unique_ptr(&local_20);
  return (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Reflection::Struct> get_options() final {
			auto options = std::make_unique<Options>(Configurable::OptionsType::UserFriendly);
			options->output = get_video_signal_configurable();
			options->use_square_pixels = video_.get_use_square_pixels();
			return options;
		}